

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Point2f __thiscall pbrt::ZSobolSampler::Get2D(ZSobolSampler *this)

{
  uint64_t uVar1;
  ulong uVar2;
  uint *puVar3;
  uint uVar4;
  uint64_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar14 [16];
  undefined1 in_ZMM3 [64];
  OwenScrambler local_40;
  OwenScrambler local_3c;
  undefined1 local_38 [16];
  
  auVar14 = in_ZMM3._0_16_;
  auVar13 = in_ZMM2._0_16_;
  auVar11 = in_ZMM0._0_16_;
  uVar1 = GetSampleIndex(this);
  uVar2 = (ulong)(this->seed ^ this->dimension);
  uVar2 = (uVar2 >> 0x1f ^ uVar2) * 0x7fb5d329728ea185;
  lVar9 = (uVar2 >> 0x1b ^ uVar2) * -0x7e25210b43d22bb3;
  local_3c.seed = (uint32_t)((ulong)lVar9 >> 0x20);
  local_40.seed = local_3c.seed >> 1 ^ (uint)lVar9;
  this->dimension = this->dimension + 2;
  switch(this->randomizeStrategy) {
  case None:
    auVar11 = ZEXT816(0) << 0x40;
    auVar12 = ZEXT816(0) << 0x40;
    if (uVar1 != 0) {
      uVar4 = 0;
      puVar3 = &SobolMatrices32;
      uVar5 = uVar1;
      do {
        if ((uVar5 & 1) != 0) {
          uVar4 = uVar4 ^ *puVar3;
        }
        puVar3 = puVar3 + 1;
        bVar10 = 1 < uVar5;
        uVar5 = (long)uVar5 >> 1;
      } while (bVar10);
      auVar13 = vcvtusi2ss_avx512f(auVar13,uVar4);
      auVar12 = ZEXT416((uint)(auVar13._0_4_ * 2.3283064e-10));
    }
    if (uVar1 != 0) {
      puVar3 = &DAT_02c1ab20;
      uVar4 = 0;
      do {
        if ((uVar1 & 1) != 0) {
          uVar4 = uVar4 ^ *puVar3;
        }
        puVar3 = puVar3 + 1;
        bVar10 = 1 < uVar1;
        uVar1 = (long)uVar1 >> 1;
      } while (bVar10);
      auVar11 = vcvtusi2ss_avx512f(auVar14,uVar4);
      auVar11 = ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10));
    }
    local_38 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar12);
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar11);
    goto LAB_002ec6ef;
  case CranleyPatterson:
    uVar4 = 0;
    uVar6 = 0;
    if (uVar1 != 0) {
      uVar6 = 0;
      puVar3 = &SobolMatrices32;
      uVar5 = uVar1;
      do {
        if ((uVar5 & 1) != 0) {
          uVar6 = uVar6 ^ *puVar3;
        }
        puVar3 = puVar3 + 1;
        bVar10 = 1 < uVar5;
        uVar5 = (long)uVar5 >> 1;
      } while (bVar10);
    }
    auVar11 = vcvtusi2ss_avx512f(auVar11,uVar6 + local_40.seed);
    if (uVar1 != 0) {
      puVar3 = &DAT_02c1ab20;
      uVar4 = 0;
      do {
        if ((uVar1 & 1) != 0) {
          uVar4 = uVar4 ^ *puVar3;
        }
        puVar3 = puVar3 + 1;
        bVar10 = 1 < uVar1;
        uVar1 = (long)uVar1 >> 1;
      } while (bVar10);
    }
    local_38 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                          ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10)));
    uVar4 = uVar4 + local_3c.seed;
    break;
  case PermuteDigits:
    uVar4 = 0;
    uVar6 = 0;
    if (uVar1 != 0) {
      uVar6 = 0;
      puVar3 = &SobolMatrices32;
      uVar5 = uVar1;
      do {
        if ((uVar5 & 1) != 0) {
          uVar6 = uVar6 ^ *puVar3;
        }
        puVar3 = puVar3 + 1;
        bVar10 = 1 < uVar5;
        uVar5 = (long)uVar5 >> 1;
      } while (bVar10);
    }
    auVar11 = vcvtusi2ss_avx512f(auVar11,uVar6 ^ local_40.seed);
    if (uVar1 != 0) {
      puVar3 = &DAT_02c1ab20;
      uVar4 = 0;
      do {
        if ((uVar1 & 1) != 0) {
          uVar4 = uVar4 ^ *puVar3;
        }
        puVar3 = puVar3 + 1;
        bVar10 = 1 < uVar1;
        uVar1 = (long)uVar1 >> 1;
      } while (bVar10);
    }
    local_38 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                          ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10)));
    uVar4 = uVar4 ^ local_3c.seed;
    break;
  case FastOwen:
    if (uVar1 != 0) {
      do {
        bVar10 = 1 < uVar1;
        uVar1 = (long)uVar1 >> 1;
      } while (bVar10);
    }
    halt_baddata();
  default:
    uVar7 = 0;
    uVar8 = 0;
    if (uVar1 != 0) {
      uVar8 = 0;
      puVar3 = &SobolMatrices32;
      uVar5 = uVar1;
      do {
        if ((uVar5 & 1) != 0) {
          uVar8 = uVar8 ^ *puVar3;
        }
        puVar3 = puVar3 + 1;
        bVar10 = 1 < uVar5;
        uVar5 = (long)uVar5 >> 1;
      } while (bVar10);
    }
    uVar8 = OwenScrambler::operator()(&local_40,uVar8);
    auVar11 = vcvtusi2ss_avx512f(auVar11,uVar8);
    if (uVar1 != 0) {
      puVar3 = &DAT_02c1ab20;
      uVar7 = 0;
      do {
        if ((uVar1 & 1) != 0) {
          uVar7 = uVar7 ^ *puVar3;
        }
        puVar3 = puVar3 + 1;
        bVar10 = 1 < uVar1;
        uVar1 = (long)uVar1 >> 1;
      } while (bVar10);
    }
    local_38 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                          ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10)));
    uVar7 = OwenScrambler::operator()(&local_3c,uVar7);
    auVar11 = vcvtusi2ss_avx512f(auVar13,uVar7);
    auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10)));
    goto LAB_002ec6ef;
  }
  auVar11 = vcvtusi2ss_avx512f(auVar13,uVar4);
  auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(auVar11._0_4_ * 2.3283064e-10))
                      );
LAB_002ec6ef:
  auVar11 = vinsertps_avx(local_38,auVar11,0x10);
  return (Point2f)auVar11._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        uint64_t sampleIndex = GetSampleIndex();
        uint64_t bits = MixBits(dimension ^ seed);
        uint32_t sampleHash[2] = {uint32_t(bits), uint32_t(bits >> 32)};

        dimension += 2;

        if (randomizeStrategy == RandomizeStrategy::None)
            return {SobolSample(sampleIndex, 0, NoRandomizer()),
                    SobolSample(sampleIndex, 1, NoRandomizer())};
        else if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            return {SobolSample(sampleIndex, 0, CranleyPattersonRotator(sampleHash[0])),
                    SobolSample(sampleIndex, 1, CranleyPattersonRotator(sampleHash[1]))};
        else if (randomizeStrategy == RandomizeStrategy::PermuteDigits)
            return {SobolSample(sampleIndex, 0, BinaryPermuteScrambler(sampleHash[0])),
                    SobolSample(sampleIndex, 1, BinaryPermuteScrambler(sampleHash[1]))};
        else if (randomizeStrategy == RandomizeStrategy::FastOwen)
            return {SobolSample(sampleIndex, 0, FastOwenScrambler(sampleHash[0])),
                    SobolSample(sampleIndex, 1, FastOwenScrambler(sampleHash[1]))};
        else
            return {SobolSample(sampleIndex, 0, OwenScrambler(sampleHash[0])),
                    SobolSample(sampleIndex, 1, OwenScrambler(sampleHash[1]))};
    }